

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_base.hpp
# Opt level: O0

void boost::detail::function::
     functor_manager<boost::algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>_>_>
     ::manager(long *param_1,long *param_2,int param_3)

{
  int iVar1;
  void *pvVar2;
  char *__s1;
  char *__s2;
  sp_typeinfo *check_type;
  functor_type *f_1;
  functor_type *new_f;
  functor_type *f;
  token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *in_stack_ffffffffffffff98;
  token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *in_stack_ffffffffffffffa0;
  
  if (param_3 == 0) {
    pvVar2 = operator_new(0x20);
    algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>_>::token_finderF
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    *param_2 = (long)pvVar2;
  }
  else if (param_3 == 1) {
    *param_2 = *param_1;
    *param_1 = 0;
  }
  else if (param_3 == 2) {
    pvVar2 = (void *)*param_2;
    if (pvVar2 != (void *)0x0) {
      algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>_>::~token_finderF
                ((token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *)0x195746);
      operator_delete(pvVar2);
    }
    *param_2 = 0;
  }
  else if (param_3 == 3) {
    __s1 = std::type_info::name((type_info *)*param_2);
    __s2 = std::type_info::name
                     ((type_info *)
                      &algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>>
                       ::typeinfo);
    iVar1 = strcmp(__s1,__s2);
    if (iVar1 == 0) {
      *param_2 = *param_1;
    }
    else {
      *param_2 = 0;
    }
  }
  else {
    *param_2 = (long)&algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>>::
                      typeinfo;
    *(undefined1 *)(param_2 + 1) = 0;
    *(undefined1 *)((long)param_2 + 9) = 0;
  }
  return;
}

Assistant:

static inline void
        manager(const function_buffer& in_buffer, function_buffer& out_buffer, 
                functor_manager_operation_type op, mpl::false_)
        {
          if (op == clone_functor_tag) {
            // Clone the functor
            // GCC 2.95.3 gets the CV qualifiers wrong here, so we
            // can't do the static_cast that we should do.
            // jewillco: Changing this to static_cast because GCC 2.95.3 is
            // obsolete.
            const functor_type* f =
              static_cast<const functor_type*>(in_buffer.obj_ptr);
            functor_type* new_f = new functor_type(*f);
            out_buffer.obj_ptr = new_f;
          } else if (op == move_functor_tag) {
            out_buffer.obj_ptr = in_buffer.obj_ptr;
            in_buffer.obj_ptr = 0;
          } else if (op == destroy_functor_tag) {
            /* Cast from the void pointer to the functor pointer type */
            functor_type* f =
              static_cast<functor_type*>(out_buffer.obj_ptr);
            delete f;
            out_buffer.obj_ptr = 0;
          } else if (op == check_functor_type_tag) {
            const detail::sp_typeinfo& check_type
              = *out_buffer.type.type;
            if (BOOST_FUNCTION_COMPARE_TYPE_ID(check_type, BOOST_SP_TYPEID(Functor)))
              out_buffer.obj_ptr = in_buffer.obj_ptr;
            else
              out_buffer.obj_ptr = 0;
          } else /* op == get_functor_type_tag */ {
            out_buffer.type.type = &BOOST_SP_TYPEID(Functor);
            out_buffer.type.const_qualified = false;
            out_buffer.type.volatile_qualified = false;
          }
        }